

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> * __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>
           *__return_storage_ptr__,FastInstancesIterator *this)

{
  bool bVar1;
  int iVar2;
  LiteralClause *pLVar3;
  InstMatcher *this_00;
  Renaming normalizer;
  Renaming local_78;
  undefined1 local_48 [32];
  undefined4 extraout_var;
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  pLVar3 = (LiteralClause *)CONCAT44(extraout_var,iVar2);
  if (this->_retrieveSubstitution == true) {
    Kernel::Renaming::reset(&this->_resultDenormalizer);
    bVar1 = Kernel::Term::ground(&pLVar3->literal->super_Term);
    if (!bVar1) {
      local_78._data._timestamp = 1;
      local_78._36_8_ = 0;
      local_78._data._size = 0;
      local_78._data._deleted = 0;
      local_78._data._capacityIndex = 0;
      local_78._data._capacity = 0;
      local_78._data._20_8_ = 0;
      local_78._data._28_8_ = 0;
      local_78._identity = true;
      Kernel::Renaming::normalizeVariables(&local_78,pLVar3->literal);
      Kernel::Renaming::makeInverse(&this->_resultDenormalizer,&local_78);
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                (&local_78._data);
    }
    this_00 = (InstMatcher *)(local_48 + 0x10);
    SubstitutionTree<Indexing::LiteralClause>::InstMatcher::getSubstitution
              (this_00,(Renaming *)&this->_subst);
  }
  else {
    this_00 = (InstMatcher *)local_48;
    local_48._0_8_ = 0;
    local_48._8_8_ = (TermList *)0x0;
  }
  Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
            (&__return_storage_ptr__->unifier,(SmartPtr<Indexing::ResultSubstitution> *)this_00);
  __return_storage_ptr__->data = pLVar3;
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}